

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

void __thiscall QStyleOptionProgressBar::QStyleOptionProgressBar(QStyleOptionProgressBar *this)

{
  undefined8 in_RDI;
  
  QStyleOptionProgressBar(this,(int)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

QStyleOptionProgressBar::QStyleOptionProgressBar()
    : QStyleOptionProgressBar(QStyleOptionProgressBar::Version)
{
}